

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

UCPTrie * __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::build
          (MutableCodePointTrie *this,UCPTrieType type,UCPTrieValueWidth valueWidth,
          UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  UChar32 *__dest;
  int local_68;
  int local_64;
  int32_t i_2;
  int32_t i_1;
  uint32_t *p;
  int32_t j;
  int32_t i;
  uint16_t *dest16;
  UCPTrie *trie;
  uint8_t *bytes;
  int32_t and3;
  int32_t length;
  int32_t indexLength;
  UChar32 fastLimit;
  UErrorCode *errorCode_local;
  UCPTrieValueWidth valueWidth_local;
  UCPTrieType type_local;
  MutableCodePointTrie *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if ((((type < UCPTRIE_TYPE_FAST) || (UCPTRIE_TYPE_SMALL < type)) ||
        (valueWidth < UCPTRIE_VALUE_BITS_16)) || (UCPTRIE_VALUE_BITS_8 < valueWidth)) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      this_local = (MutableCodePointTrie *)0x0;
    }
    else {
      if (valueWidth == UCPTRIE_VALUE_BITS_16) {
        maskValues(this,0xffff);
      }
      else if ((valueWidth != UCPTRIE_VALUE_BITS_32) && (valueWidth == UCPTRIE_VALUE_BITS_8)) {
        maskValues(this,0xff);
      }
      iVar2 = 0x1000;
      if (type == UCPTRIE_TYPE_FAST) {
        iVar2 = 0x10000;
      }
      uVar3 = compactTrie(this,iVar2 >> 4,errorCode);
      UVar1 = ::U_FAILURE(*errorCode);
      if (UVar1 == '\0') {
        and3 = uVar3;
        if ((valueWidth == UCPTRIE_VALUE_BITS_32) && ((uVar3 & 1) != 0)) {
          and3 = uVar3 + 1;
          this->index16[(int)uVar3] = 0xffee;
        }
        if (valueWidth == UCPTRIE_VALUE_BITS_16) {
          if (((and3 ^ this->dataLength) & 1U) != 0) {
            iVar4 = this->dataLength;
            this->dataLength = iVar4 + 1;
            this->data[iVar4] = this->errorValue;
          }
          if ((this->data[this->dataLength + -1] != this->errorValue) ||
             (this->data[this->dataLength + -2] != this->highValue)) {
            iVar4 = this->dataLength;
            this->dataLength = iVar4 + 1;
            this->data[iVar4] = this->highValue;
            iVar4 = this->dataLength;
            this->dataLength = iVar4 + 1;
            this->data[iVar4] = this->errorValue;
          }
          iVar4 = this->dataLength * 2;
        }
        else if (valueWidth == UCPTRIE_VALUE_BITS_32) {
          if ((this->data[this->dataLength + -1] != this->errorValue) ||
             (this->data[this->dataLength + -2] != this->highValue)) {
            if (this->data[this->dataLength + -1] != this->highValue) {
              iVar4 = this->dataLength;
              this->dataLength = iVar4 + 1;
              this->data[iVar4] = this->highValue;
            }
            iVar4 = this->dataLength;
            this->dataLength = iVar4 + 1;
            this->data[iVar4] = this->errorValue;
          }
          iVar4 = this->dataLength * 4;
        }
        else {
          bytes._0_4_ = and3 * 2 + this->dataLength & 3;
          if ((((uint)bytes != 0) || (this->data[this->dataLength + -1] != this->errorValue)) ||
             (this->data[this->dataLength + -2] != this->highValue)) {
            if (((uint)bytes == 3) && (this->data[this->dataLength + -1] == this->highValue)) {
              iVar4 = this->dataLength;
              this->dataLength = iVar4 + 1;
              this->data[iVar4] = this->errorValue;
            }
            else {
              for (; (uint)bytes != 2; bytes._0_4_ = (uint)bytes + 1 & 3) {
                iVar4 = this->dataLength;
                this->dataLength = iVar4 + 1;
                this->data[iVar4] = this->highValue;
              }
              iVar4 = this->dataLength;
              this->dataLength = iVar4 + 1;
              this->data[iVar4] = this->highValue;
              iVar4 = this->dataLength;
              this->dataLength = iVar4 + 1;
              this->data[iVar4] = this->errorValue;
            }
          }
          iVar4 = this->dataLength;
        }
        bytes._4_4_ = iVar4 + and3 * 2;
        this_local = (MutableCodePointTrie *)uprv_malloc_63((long)(bytes._4_4_ + 0x30));
        if (this_local == (MutableCodePointTrie *)0x0) {
          *errorCode = U_MEMORY_ALLOCATION_ERROR;
          clear(this);
          this_local = (MutableCodePointTrie *)0x0;
        }
        else {
          memset(this_local,0,0x30);
          *(int32_t *)&this_local->data = and3;
          *(int32_t *)((long)&this_local->data + 4) = this->dataLength;
          this_local->dataCapacity = this->highStart;
          *(short *)&this_local->dataLength = (short)(this->highStart + 0xfff >> 0xc);
          *(char *)((long)&this_local->dataLength + 2) = (char)type;
          *(char *)((long)&this_local->dataLength + 3) = (char)valueWidth;
          *(short *)((long)&this_local->origInitialValue + 2) = (short)this->index3NullOffset;
          this_local->initialValue = this->dataNullOffset;
          this_local->errorValue = this->initialValue;
          __dest = &this_local->highStart;
          this_local->index = (uint32_t *)__dest;
          if (iVar2 < this->highStart) {
            memcpy(__dest,this->index16,(long)(and3 << 1));
            _j = (UChar32 *)((long)__dest + (long)and3 * 2);
          }
          else {
            p._4_4_ = 0;
            _j = __dest;
            for (p._0_4_ = 0; (int)p < and3; p._0_4_ = (int)p + 1) {
              *(short *)_j = (short)this->index[p._4_4_];
              p._4_4_ = p._4_4_ + 4;
              _j = (UChar32 *)((long)_j + 2);
            }
          }
          trie = (UCPTrie *)((long)__dest + (long)(and3 * 2));
          _i_2 = this->data;
          if (valueWidth == UCPTRIE_VALUE_BITS_16) {
            *(UChar32 **)&this_local->indexCapacity = _j;
            for (local_64 = this->dataLength; 0 < local_64; local_64 = local_64 + -1) {
              *(short *)_j = (short)*_i_2;
              _i_2 = _i_2 + 1;
              _j = (UChar32 *)((long)_j + 2);
            }
          }
          else if (valueWidth == UCPTRIE_VALUE_BITS_32) {
            *(UCPTrie **)&this_local->indexCapacity = trie;
            memcpy(trie,_i_2,(long)this->dataLength << 2);
          }
          else if (valueWidth == UCPTRIE_VALUE_BITS_8) {
            *(UCPTrie **)&this_local->indexCapacity = trie;
            for (local_68 = this->dataLength; 0 < local_68; local_68 = local_68 + -1) {
              *(char *)&trie->index = (char)*_i_2;
              _i_2 = _i_2 + 1;
              trie = (UCPTrie *)((long)&trie->index + 1);
            }
          }
          clear(this);
        }
      }
      else {
        clear(this);
        this_local = (MutableCodePointTrie *)0x0;
      }
    }
  }
  else {
    this_local = (MutableCodePointTrie *)0x0;
  }
  return (UCPTrie *)this_local;
}

Assistant:

UCPTrie *MutableCodePointTrie::build(UCPTrieType type, UCPTrieValueWidth valueWidth, UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) {
        return nullptr;
    }
    if (type < UCPTRIE_TYPE_FAST || UCPTRIE_TYPE_SMALL < type ||
            valueWidth < UCPTRIE_VALUE_BITS_16 || UCPTRIE_VALUE_BITS_8 < valueWidth) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return nullptr;
    }

    // The mutable trie always stores 32-bit values.
    // When we build a UCPTrie for a smaller value width, we first mask off unused bits
    // before compacting the data.
    switch (valueWidth) {
    case UCPTRIE_VALUE_BITS_32:
        break;
    case UCPTRIE_VALUE_BITS_16:
        maskValues(0xffff);
        break;
    case UCPTRIE_VALUE_BITS_8:
        maskValues(0xff);
        break;
    default:
        break;
    }

    UChar32 fastLimit = type == UCPTRIE_TYPE_FAST ? BMP_LIMIT : UCPTRIE_SMALL_LIMIT;
    int32_t indexLength = compactTrie(fastLimit >> UCPTRIE_SHIFT_3, errorCode);
    if (U_FAILURE(errorCode)) {
        clear();
        return nullptr;
    }

    // Ensure data table alignment: The index length must be even for uint32_t data.
    if (valueWidth == UCPTRIE_VALUE_BITS_32 && (indexLength & 1) != 0) {
        index16[indexLength++] = 0xffee;  // arbitrary value
    }

    // Make the total trie structure length a multiple of 4 bytes by padding the data table,
    // and store special values as the last two data values.
    int32_t length = indexLength * 2;
    if (valueWidth == UCPTRIE_VALUE_BITS_16) {
        if (((indexLength ^ dataLength) & 1) != 0) {
            // padding
            data[dataLength++] = errorValue;
        }
        if (data[dataLength - 1] != errorValue || data[dataLength - 2] != highValue) {
            data[dataLength++] = highValue;
            data[dataLength++] = errorValue;
        }
        length += dataLength * 2;
    } else if (valueWidth == UCPTRIE_VALUE_BITS_32) {
        // 32-bit data words never need padding to a multiple of 4 bytes.
        if (data[dataLength - 1] != errorValue || data[dataLength - 2] != highValue) {
            if (data[dataLength - 1] != highValue) {
                data[dataLength++] = highValue;
            }
            data[dataLength++] = errorValue;
        }
        length += dataLength * 4;
    } else {
        int32_t and3 = (length + dataLength) & 3;
        if (and3 == 0 && data[dataLength - 1] == errorValue && data[dataLength - 2] == highValue) {
            // all set
        } else if(and3 == 3 && data[dataLength - 1] == highValue) {
            data[dataLength++] = errorValue;
        } else {
            while (and3 != 2) {
                data[dataLength++] = highValue;
                and3 = (and3 + 1) & 3;
            }
            data[dataLength++] = highValue;
            data[dataLength++] = errorValue;
        }
        length += dataLength;
    }

    // Calculate the total length of the UCPTrie as a single memory block.
    length += sizeof(UCPTrie);
    U_ASSERT((length & 3) == 0);

    uint8_t *bytes = (uint8_t *)uprv_malloc(length);
    if (bytes == nullptr) {
        errorCode = U_MEMORY_ALLOCATION_ERROR;
        clear();
        return nullptr;
    }
    UCPTrie *trie = reinterpret_cast<UCPTrie *>(bytes);
    uprv_memset(trie, 0, sizeof(UCPTrie));
    trie->indexLength = indexLength;
    trie->dataLength = dataLength;

    trie->highStart = highStart;
    // Round up shifted12HighStart to a multiple of 0x1000 for easy testing from UTF-8 lead bytes.
    // Runtime code needs to then test for the real highStart as well.
    trie->shifted12HighStart = (highStart + 0xfff) >> 12;
    trie->type = type;
    trie->valueWidth = valueWidth;

    trie->index3NullOffset = index3NullOffset;
    trie->dataNullOffset = dataNullOffset;
    trie->nullValue = initialValue;

    bytes += sizeof(UCPTrie);

    // Fill the index and data arrays.
    uint16_t *dest16 = (uint16_t *)bytes;
    trie->index = dest16;

    if (highStart <= fastLimit) {
        // Condense only the fast index from the mutable-trie index.
        for (int32_t i = 0, j = 0; j < indexLength; i += SMALL_DATA_BLOCKS_PER_BMP_BLOCK, ++j) {
            *dest16++ = (uint16_t)index[i];  // dest16[j]
        }
    } else {
        uprv_memcpy(dest16, index16, indexLength * 2);
        dest16 += indexLength;
    }
    bytes += indexLength * 2;

    // Write the data array.
    const uint32_t *p = data;
    switch (valueWidth) {
    case UCPTRIE_VALUE_BITS_16:
        // Write 16-bit data values.
        trie->data.ptr16 = dest16;
        for (int32_t i = dataLength; i > 0; --i) {
            *dest16++ = (uint16_t)*p++;
        }
        break;
    case UCPTRIE_VALUE_BITS_32:
        // Write 32-bit data values.
        trie->data.ptr32 = (uint32_t *)bytes;
        uprv_memcpy(bytes, p, (size_t)dataLength * 4);
        break;
    case UCPTRIE_VALUE_BITS_8:
        // Write 8-bit data values.
        trie->data.ptr8 = bytes;
        for (int32_t i = dataLength; i > 0; --i) {
            *bytes++ = (uint8_t)*p++;
        }
        break;
    default:
        // Will not occur, valueWidth checked at the beginning.
        break;
    }

#ifdef UCPTRIE_DEBUG
    trie->name = name;

    ucptrie_printLengths(trie, "");
#endif

    clear();
    return trie;
}